

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynlink.c
# Opt level: O1

int dynlink_library_path(dynlink_name name,char *path,size_t *length)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  dynlink_name_impl name_impl;
  char acStack_1018 [4096];
  
  dynlink_impl_get_name(name,acStack_1018,0x1000);
  iVar1 = portability_library_path(acStack_1018,path,length);
  iVar2 = 1;
  if (iVar1 == 0) {
    if (length == (size_t *)0x0) {
      sVar4 = strnlen(path,0x1000);
      portability_path_get_directory_inplace(path,sVar4 + 1);
    }
    else {
      sVar3 = portability_path_get_directory_inplace(path,*length + 1);
      *length = sVar3 - 1;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int dynlink_library_path(dynlink_name name, dynlink_library_path_str path, size_t *length)
{
	dynlink_name_impl name_impl;

	dynlink_impl_get_name(name, name_impl, PORTABILITY_PATH_SIZE);

	if (portability_library_path(name_impl, path, length) != 0)
	{
		return 1;
	}

	if (length != NULL)
	{
		*length = portability_path_get_directory_inplace(path, (*length) + 1) - 1;
	}
	else
	{
		(void)portability_path_get_directory_inplace(path, strnlen(path, sizeof(dynlink_library_path_str) / sizeof(char)) + 1);
	}

	return 0;
}